

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

void get_all_encoding_parameters
               (opj_image_t *p_image,opj_cp_v2_t *p_cp,OPJ_UINT32 tileno,OPJ_INT32 *p_tx0,
               OPJ_INT32 *p_tx1,OPJ_INT32 *p_ty0,OPJ_INT32 *p_ty1,OPJ_UINT32 *p_dx_min,
               OPJ_UINT32 *p_dy_min,OPJ_UINT32 *p_max_prec,OPJ_UINT32 *p_max_res,
               OPJ_UINT32 **p_resolutions)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int a;
  int a_00;
  int a_01;
  int iVar5;
  int iVar6;
  int a_02;
  int a_03;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int *in_RCX;
  uint in_EDX;
  uint uVar11;
  int *piVar12;
  long in_RSI;
  int *in_RDI;
  int *in_R8;
  int *in_R9;
  OPJ_UINT32 l_dy;
  OPJ_UINT32 l_dx;
  OPJ_UINT32 l_ph;
  OPJ_UINT32 l_pw;
  OPJ_UINT32 l_pdy;
  OPJ_UINT32 l_pdx;
  OPJ_INT32 l_tcy1;
  OPJ_INT32 l_tcx1;
  OPJ_INT32 l_tcy0;
  OPJ_INT32 l_tcx0;
  OPJ_UINT32 l_product;
  OPJ_INT32 py1;
  OPJ_INT32 l_px1;
  OPJ_INT32 l_py0;
  OPJ_INT32 l_px0;
  OPJ_INT32 l_ry1;
  OPJ_INT32 l_rx1;
  OPJ_INT32 l_ry0;
  OPJ_INT32 l_rx0;
  OPJ_UINT32 l_level_no;
  OPJ_UINT32 q;
  OPJ_UINT32 p;
  OPJ_UINT32 *lResolutionPtr;
  opj_image_comp_t *l_img_comp;
  opj_tccp_t *l_tccp;
  opj_tcp_v2_t *tcp;
  OPJ_UINT32 resno;
  OPJ_UINT32 compno;
  int local_b8;
  int local_b4;
  int local_64;
  int *local_58;
  int *local_50;
  long local_48;
  uint local_38;
  uint local_34;
  
  local_48 = *(long *)(*(long *)(in_RSI + 0x60) + (ulong)in_EDX * 0x1630 + 0x15d0);
  local_50 = *(int **)(in_RDI + 6);
  uVar11 = in_EDX % *(uint *)(in_RSI + 0x20);
  uVar3 = in_EDX / *(uint *)(in_RSI + 0x20);
  iVar4 = int_max(*(int *)(in_RSI + 4) + uVar11 * *(int *)(in_RSI + 0xc),*in_RDI);
  *in_RCX = iVar4;
  iVar4 = int_min(*(int *)(in_RSI + 4) + (uVar11 + 1) * *(int *)(in_RSI + 0xc),in_RDI[2]);
  *in_R8 = iVar4;
  iVar4 = int_max(*(int *)(in_RSI + 8) + uVar3 * *(int *)(in_RSI + 0x10),in_RDI[1]);
  *in_R9 = iVar4;
  iVar4 = int_min(*(int *)(in_RSI + 8) + (uVar3 + 1) * *(int *)(in_RSI + 0x10),in_RDI[3]);
  *_l_dy = iVar4;
  *_l_tcy1 = 0;
  *_l_tcy0 = 0;
  *_l_ph = 0x7fffffff;
  *_l_pdy = 0x7fffffff;
  for (local_34 = 0; local_34 < (uint)in_RDI[4]; local_34 = local_34 + 1) {
    local_58 = *(int **)(_l_product + (ulong)local_34 * 8);
    iVar4 = int_ceildiv(*in_RCX,*local_50);
    a = int_ceildiv(*in_R9,local_50[1]);
    a_00 = int_ceildiv(*in_R8,*local_50);
    a_01 = int_ceildiv(*_l_dy,local_50[1]);
    if (*_l_tcy0 < *(uint *)(local_48 + 4)) {
      *_l_tcy0 = *(uint *)(local_48 + 4);
    }
    local_64 = *(int *)(local_48 + 4);
    for (local_38 = 0; local_64 = local_64 + -1, local_38 < *(uint *)(local_48 + 4);
        local_38 = local_38 + 1) {
      iVar9 = *(int *)(local_48 + 0x32c + (ulong)local_38 * 4);
      iVar10 = *(int *)(local_48 + 0x3b0 + (ulong)local_38 * 4);
      *local_58 = iVar9;
      local_58[1] = iVar10;
      bVar1 = (byte)iVar9;
      iVar6 = local_50[1];
      bVar2 = (byte)iVar10;
      iVar5 = int_min(*_l_ph,*local_50 * (1 << (bVar1 + (char)local_64 & 0x1f)));
      *_l_ph = iVar5;
      iVar6 = int_min(*_l_pdy,iVar6 * (1 << (bVar2 + (char)local_64 & 0x1f)));
      *_l_pdy = iVar6;
      iVar6 = int_ceildivpow2(iVar4,local_64);
      iVar5 = int_ceildivpow2(a,local_64);
      a_02 = int_ceildivpow2(a_00,local_64);
      a_03 = int_ceildivpow2(a_01,local_64);
      iVar7 = int_floordivpow2(iVar6,iVar9);
      iVar8 = int_floordivpow2(iVar5,iVar10);
      iVar9 = int_ceildivpow2(a_02,iVar9);
      iVar10 = int_ceildivpow2(a_03,iVar10);
      if (iVar6 == a_02) {
        local_b4 = 0;
      }
      else {
        local_b4 = (iVar9 << (bVar1 & 0x1f)) - (iVar7 << (bVar1 & 0x1f)) >> (bVar1 & 0x1f);
      }
      if (iVar5 == a_03) {
        local_b8 = 0;
      }
      else {
        local_b8 = (iVar10 << (bVar2 & 0x1f)) - (iVar8 << (bVar2 & 0x1f)) >> (bVar2 & 0x1f);
      }
      piVar12 = local_58 + 3;
      local_58[2] = local_b4;
      local_58 = local_58 + 4;
      *piVar12 = local_b8;
      if (*_l_tcy1 < (uint)(local_b4 * local_b8)) {
        *_l_tcy1 = local_b4 * local_b8;
      }
    }
    local_48 = local_48 + 0x438;
    local_50 = local_50 + 0xe;
  }
  return;
}

Assistant:

void get_all_encoding_parameters(
								const opj_image_t *p_image,
								const opj_cp_v2_t *p_cp,
								OPJ_UINT32 tileno,
								OPJ_INT32 * p_tx0,
								OPJ_INT32 * p_tx1,
								OPJ_INT32 * p_ty0,
								OPJ_INT32 * p_ty1,
								OPJ_UINT32 * p_dx_min,
								OPJ_UINT32 * p_dy_min,
								OPJ_UINT32 * p_max_prec,
								OPJ_UINT32 * p_max_res,
								OPJ_UINT32 ** p_resolutions
							)
{
	// loop
	OPJ_UINT32 compno, resno;

	// pointers
	const opj_tcp_v2_t *tcp = 00;
	const opj_tccp_t * l_tccp = 00;
	const opj_image_comp_t * l_img_comp = 00;

	// to store l_dx, l_dy, w and h for each resolution and component.
	OPJ_UINT32 * lResolutionPtr;

	// position in x and y of tile
	OPJ_UINT32 p, q;

	// preconditions in debug
	assert(p_cp != 00);
	assert(p_image != 00);
	assert(tileno < p_cp->tw * p_cp->th);

	// initializations
	tcp = &p_cp->tcps [tileno];
	l_tccp = tcp->tccps;
	l_img_comp = p_image->comps;

	// position in x and y of tile

	p = tileno % p_cp->tw;
	q = tileno / p_cp->tw;

	/* here calculation of tx0, tx1, ty0, ty1, maxprec, l_dx and l_dy */
	*p_tx0 = int_max(p_cp->tx0 + p * p_cp->tdx, p_image->x0);
	*p_tx1 = int_min(p_cp->tx0 + (p + 1) * p_cp->tdx, p_image->x1);
	*p_ty0 = int_max(p_cp->ty0 + q * p_cp->tdy, p_image->y0);
	*p_ty1 = int_min(p_cp->ty0 + (q + 1) * p_cp->tdy, p_image->y1);

	// max precision and resolution is 0 (can only grow)
	*p_max_prec = 0;
	*p_max_res = 0;

	// take the largest value for dx_min and dy_min
	*p_dx_min = 0x7fffffff;
	*p_dy_min  = 0x7fffffff;

	for
		(compno = 0; compno < p_image->numcomps; ++compno)
	{
		// aritmetic variables to calculate
		OPJ_UINT32 l_level_no;
		OPJ_INT32 l_rx0, l_ry0, l_rx1, l_ry1;
		OPJ_INT32 l_px0, l_py0, l_px1, py1;
		OPJ_UINT32 l_product;
		OPJ_INT32 l_tcx0, l_tcy0, l_tcx1, l_tcy1;
		OPJ_UINT32 l_pdx, l_pdy , l_pw , l_ph;

		lResolutionPtr = p_resolutions[compno];

		l_tcx0 = int_ceildiv(*p_tx0, l_img_comp->dx);
		l_tcy0 = int_ceildiv(*p_ty0, l_img_comp->dy);
		l_tcx1 = int_ceildiv(*p_tx1, l_img_comp->dx);
		l_tcy1 = int_ceildiv(*p_ty1, l_img_comp->dy);
		if
			(l_tccp->numresolutions > *p_max_res)
		{
			*p_max_res = l_tccp->numresolutions;
		}

		// use custom size for precincts
		l_level_no = l_tccp->numresolutions - 1;
		for
			(resno = 0; resno < l_tccp->numresolutions; ++resno)
		{
			OPJ_UINT32 l_dx, l_dy;
			// precinct width and height
			l_pdx = l_tccp->prcw[resno];
			l_pdy = l_tccp->prch[resno];
			*lResolutionPtr++ = l_pdx;
			*lResolutionPtr++ = l_pdy;
			l_dx = l_img_comp->dx * (1 << (l_pdx + l_level_no));
			l_dy = l_img_comp->dy * (1 << (l_pdy + l_level_no));
			// take the minimum size for l_dx for each comp and resolution
			*p_dx_min = int_min(*p_dx_min, l_dx);
			*p_dy_min = int_min(*p_dy_min, l_dy);
			// various calculations of extents

			l_rx0 = int_ceildivpow2(l_tcx0, l_level_no);
			l_ry0 = int_ceildivpow2(l_tcy0, l_level_no);
			l_rx1 = int_ceildivpow2(l_tcx1, l_level_no);
			l_ry1 = int_ceildivpow2(l_tcy1, l_level_no);
			l_px0 = int_floordivpow2(l_rx0, l_pdx) << l_pdx;
			l_py0 = int_floordivpow2(l_ry0, l_pdy) << l_pdy;
			l_px1 = int_ceildivpow2(l_rx1, l_pdx) << l_pdx;
			py1 = int_ceildivpow2(l_ry1, l_pdy) << l_pdy;
			l_pw = (l_rx0==l_rx1)?0:((l_px1 - l_px0) >> l_pdx);
			l_ph = (l_ry0==l_ry1)?0:((py1 - l_py0) >> l_pdy);
			*lResolutionPtr++ = l_pw;
			*lResolutionPtr++ = l_ph;
			l_product = l_pw * l_ph;
			// update precision
			if
				(l_product > *p_max_prec)
			{
				*p_max_prec = l_product;
			}
			--l_level_no;
		}
		++l_tccp;
		++l_img_comp;
	}
}